

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

string_view __thiscall slang::parsing::Token::rawText(Token *this)

{
  SourceLocation SVar1;
  string_view sVar2;
  Info *pIVar3;
  SourceLocation *pSVar4;
  Token *this_00;
  string_view sVar5;
  
  this_00 = (Token *)(ulong)this->kind;
  sVar5 = LexerFacts::getTokenKindText(this->kind);
  if (sVar5._M_len != 0) {
    return sVar5;
  }
  switch(this->kind) {
  case Unknown:
    pIVar3 = this->info;
    if (pIVar3 == (Info *)0x0) goto switchD_0021574d_caseD_1;
    break;
  case EndOfFile:
  case Placeholder:
switchD_0021574d_caseD_1:
    return (string_view)(ZEXT816(0x4f3aa0) << 0x40);
  default:
    if ((0x187U >> (this->kind - 0x157 & 0x1f) & 1) == 0) {
      if (this_00->info == (Info *)0x0) {
        pSVar4 = (SourceLocation *)&SourceLocation::NoLocation;
      }
      else {
        pSVar4 = &this_00->info->location;
      }
      SVar1 = *pSVar4;
      sVar5 = rawText(this_00);
      sVar5._M_str = (char *)(sVar5._M_len * 0x10000000 + (long)SVar1);
      sVar5._M_len = (size_t)SVar1;
      return sVar5;
    }
  case Identifier:
  case SystemIdentifier:
  case StringLiteral:
  case IntegerLiteral:
  case IntegerBase:
  case UnbasedUnsizedLiteral:
  case RealLiteral:
  case TimeLiteral:
    pIVar3 = this->info;
  }
  sVar2._M_str = pIVar3->rawTextPtr;
  sVar2._M_len = (ulong)this->rawLen;
  return sVar2;
}

Assistant:

std::string_view Token::rawText() const {
    std::string_view text = LexerFacts::getTokenKindText(kind);
    if (!text.empty())
        return text;

    // not a simple token, so extract info from our data pointer
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
        case TokenKind::EmptyMacroArgument:
        case TokenKind::LineContinuation:
            return std::string_view(info->rawTextPtr, rawLen);
        case TokenKind::Unknown:
            if (info)
                return std::string_view(info->rawTextPtr, rawLen);
            return "";
        case TokenKind::Placeholder:
        case TokenKind::EndOfFile:
            return "";
        default:
            SLANG_UNREACHABLE;
    }
}